

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

void al_remove_path_component(ALLEGRO_PATH *path,int i)

{
  undefined8 *puVar1;
  
  if (i < 0) {
    i = i + (int)(path->segments)._size;
  }
  puVar1 = (undefined8 *)_al_vector_ref(&path->segments,i);
  al_ustr_free((ALLEGRO_USTR *)*puVar1);
  _al_vector_delete_at(&path->segments,i);
  return;
}

Assistant:

void al_remove_path_component(ALLEGRO_PATH *path, int i)
{
   ASSERT(path);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   al_ustr_free(get_segment(path, i));
   _al_vector_delete_at(&path->segments, i);
}